

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O3

int ncnn::deconvolutiondepthwise1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int group,int activation_type,Mat *activation_params,
              Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  ulong uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  float *pfVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  float *pfVar19;
  float *pfVar20;
  long lVar21;
  float *pfVar22;
  void *pvVar23;
  ulong uVar24;
  void *pvVar25;
  long lVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar33;
  undefined1 auVar32 [16];
  float fVar34;
  int iVar35;
  int iVar37;
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  void *local_130;
  float *local_118;
  ulong local_108;
  ulong local_f0;
  ulong local_e8;
  float *local_88;
  float *local_80;
  
  uVar2 = bottom_blob->h;
  local_e8 = (ulong)uVar2;
  uVar3 = top_blob->w;
  uVar15 = (ulong)uVar3;
  pvVar5 = bias_data->data;
  if (pvVar5 == (void *)0x0) {
    bVar27 = true;
  }
  else {
    bVar27 = (long)bias_data->c * bias_data->cstep == 0;
  }
  iVar4 = bottom_blob->w;
  lVar16 = (long)iVar4;
  if (top_blob->h == group && uVar2 == group) {
    if (0 < group) {
      pfVar22 = (float *)top_blob->data;
      pvVar6 = bottom_blob->data;
      sVar7 = bottom_blob->elemsize;
      pvVar25 = weight_data->data;
      lVar17 = uVar15 - 1;
      auVar36._8_4_ = (int)lVar17;
      auVar36._0_8_ = lVar17;
      auVar36._12_4_ = (int)((ulong)lVar17 >> 0x20);
      local_e8 = (long)(int)uVar3 * top_blob->elemsize;
      pfVar19 = pfVar22 + 3;
      local_108 = 0;
      auVar36 = auVar36 ^ _DAT_005a4070;
      auVar38 = _DAT_005a4930;
      auVar39 = _DAT_005a4940;
      auVar40 = _DAT_005a4070;
      do {
        fVar29 = 0.0;
        if (!bVar27) {
          fVar29 = *(float *)((long)pvVar5 + local_108 * 4);
        }
        if (0 < (int)uVar3) {
          uVar12 = 0;
          do {
            auVar30._8_4_ = (int)uVar12;
            auVar30._0_8_ = uVar12;
            auVar30._12_4_ = (int)(uVar12 >> 0x20);
            auVar32 = (auVar30 | auVar39) ^ auVar40;
            iVar11 = auVar36._0_4_;
            bVar9 = iVar11 < auVar32._0_4_;
            iVar10 = auVar32._4_4_;
            iVar33 = auVar36._4_4_;
            if ((bool)(~(iVar33 < iVar10 || iVar10 == iVar33 && bVar9) & 1)) {
              pfVar19[uVar12 - 3] = fVar29;
            }
            if (iVar33 >= iVar10 && (iVar10 != iVar33 || !bVar9)) {
              pfVar19[uVar12 - 2] = fVar29;
            }
            auVar32 = (auVar30 | auVar38) ^ auVar40;
            iVar10 = auVar32._4_4_;
            if (iVar10 <= iVar33 && (iVar10 != iVar33 || auVar32._0_4_ <= iVar11)) {
              pfVar19[uVar12 - 1] = fVar29;
              pfVar19[uVar12] = fVar29;
            }
            uVar12 = uVar12 + 4;
          } while ((uVar3 + 3 & 0xfffffffc) != uVar12);
        }
        if (0 < iVar4) {
          lVar17 = 0;
          pfVar14 = pfVar22;
          do {
            if (0 < kernel_w) {
              fVar29 = *(float *)((long)pvVar6 + lVar17 * 4 + sVar7 * lVar16 * local_108);
              uVar12 = 0;
              pfVar20 = pfVar14;
              do {
                *pfVar20 = *(float *)((long)pvVar25 + uVar12 * 4) * fVar29 + *pfVar20;
                uVar12 = uVar12 + 1;
                pfVar20 = pfVar20 + dilation_w;
              } while ((uint)kernel_w != uVar12);
            }
            lVar17 = lVar17 + 1;
            pfVar14 = pfVar14 + stride_w;
          } while (lVar17 != lVar16);
        }
        if (0 < (int)uVar3) {
          pfVar14 = (float *)activation_params->data;
          uVar12 = 0;
          do {
            fVar29 = pfVar22[uVar12];
            fVar28 = fVar29;
            switch(activation_type) {
            case 1:
              if (fVar29 <= 0.0) {
                fVar28 = 0.0;
              }
              break;
            case 2:
              fVar28 = (float)(~-(uint)(0.0 < fVar29) & (uint)*pfVar14 |
                              -(uint)(0.0 < fVar29) & 0x3f800000) * fVar29;
              break;
            case 3:
              if (fVar29 <= *pfVar14) {
                fVar29 = *pfVar14;
              }
              fVar28 = pfVar14[1];
              if (fVar29 <= pfVar14[1]) {
                fVar28 = fVar29;
              }
              break;
            case 4:
              if (88.37626 <= fVar29) {
                fVar29 = 88.37626;
              }
              fVar29 = expf((float)(-(uint)(fVar29 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar29 < -88.37626) & ((uint)fVar29 ^ auVar40._0_4_)));
              auVar38 = _DAT_005a4930;
              auVar39 = _DAT_005a4940;
              auVar40 = _DAT_005a4070;
              fVar28 = 1.0 / (fVar29 + 1.0);
              break;
            case 5:
              fVar28 = expf(fVar29);
              fVar28 = logf(fVar28 + 1.0);
              fVar28 = tanhf(fVar28);
              auVar38 = _DAT_005a4930;
              auVar39 = _DAT_005a4940;
              auVar40 = _DAT_005a4070;
              fVar28 = fVar28 * fVar29;
              break;
            case 6:
              fVar1 = *pfVar14;
              fVar34 = (float)((uint)pfVar14[1] ^ auVar40._0_4_) / fVar1;
              fVar28 = 0.0;
              if ((fVar34 <= fVar29) && (fVar28 = fVar29, fVar29 <= fVar34 + 1.0 / fVar1)) {
                fVar28 = (fVar1 * fVar29 + pfVar14[1]) * fVar29;
              }
            }
            pfVar22[uVar12] = fVar28;
            uVar12 = uVar12 + 1;
          } while (uVar15 != uVar12);
        }
        local_108 = local_108 + 1;
        pfVar19 = (float *)((long)pfVar19 + local_e8);
        pfVar22 = (float *)((long)pfVar22 + local_e8);
        pvVar25 = (void *)((long)pvVar25 + (long)kernel_w * 4);
      } while (local_108 != (uint)group);
    }
  }
  else {
    uVar12 = (long)(int)uVar2 / (long)group;
    local_e8 = uVar12 & 0xffffffff;
    iVar10 = (int)uVar12;
    if (0 < group) {
      uVar8 = (long)top_blob->h / (long)group;
      local_80 = (float *)top_blob->data;
      pvVar5 = weight_data->data;
      iVar11 = (int)uVar8;
      lVar17 = uVar15 - 1;
      auVar32._8_4_ = (int)lVar17;
      auVar32._0_8_ = lVar17;
      auVar32._12_4_ = (int)((ulong)lVar17 >> 0x20);
      lVar17 = (long)(int)uVar3 * top_blob->elemsize;
      lVar26 = lVar17 * iVar11;
      auVar32 = auVar32 ^ _DAT_005a4070;
      local_88 = local_80 + 3;
      local_e8 = 0;
      local_f0 = 0;
      auVar38 = _DAT_005a4930;
      auVar39 = _DAT_005a4940;
      auVar40 = _DAT_005a4070;
      do {
        if (0 < iVar11) {
          local_130 = (void *)((long)pvVar5 + (long)(int)local_e8 * 4);
          pvVar6 = bias_data->data;
          local_118 = local_88;
          uVar18 = 0;
          pfVar19 = local_80;
          do {
            fVar29 = 0.0;
            if (!bVar27) {
              fVar29 = *(float *)((long)pvVar6 + (local_f0 * (long)iVar11 + uVar18) * 4);
            }
            if (0 < (int)uVar3) {
              uVar13 = 0;
              do {
                auVar31._8_4_ = (int)uVar13;
                auVar31._0_8_ = uVar13;
                auVar31._12_4_ = (int)(uVar13 >> 0x20);
                auVar36 = (auVar31 | auVar39) ^ auVar40;
                iVar35 = auVar32._0_4_;
                bVar9 = iVar35 < auVar36._0_4_;
                iVar33 = auVar36._4_4_;
                iVar37 = auVar32._4_4_;
                if ((bool)(~(iVar37 < iVar33 || iVar33 == iVar37 && bVar9) & 1)) {
                  local_118[uVar13 - 3] = fVar29;
                }
                if (iVar37 >= iVar33 && (iVar33 != iVar37 || !bVar9)) {
                  local_118[uVar13 - 2] = fVar29;
                }
                auVar31 = (auVar31 | auVar38) ^ auVar40;
                iVar33 = auVar31._4_4_;
                if (iVar33 <= iVar37 && (iVar33 != iVar37 || auVar31._0_4_ <= iVar35)) {
                  local_118[uVar13 - 1] = fVar29;
                  local_118[uVar13] = fVar29;
                }
                uVar13 = uVar13 + 4;
              } while ((uVar3 + 3 & 0xfffffffc) != uVar13);
            }
            if (0 < iVar4) {
              pvVar25 = bottom_blob->data;
              iVar33 = bottom_blob->w;
              sVar7 = bottom_blob->elemsize;
              lVar21 = 0;
              pfVar22 = pfVar19;
              do {
                if (0 < iVar10) {
                  uVar13 = 0;
                  pvVar23 = local_130;
                  do {
                    if (0 < kernel_w) {
                      fVar29 = *(float *)((long)pvVar25 +
                                         (uVar13 + (uint)(iVar10 * (int)local_f0)) *
                                         (long)iVar33 * sVar7 + lVar21 * 4);
                      uVar24 = 0;
                      pfVar14 = pfVar22;
                      do {
                        *pfVar14 = *(float *)((long)pvVar23 + uVar24 * 4) * fVar29 + *pfVar14;
                        uVar24 = uVar24 + 1;
                        pfVar14 = pfVar14 + dilation_w;
                      } while ((uint)kernel_w != uVar24);
                    }
                    uVar13 = uVar13 + 1;
                    pvVar23 = (void *)((long)pvVar23 + (long)kernel_w * 4);
                  } while (uVar13 != (uVar12 & 0xffffffff));
                }
                lVar21 = lVar21 + 1;
                pfVar22 = pfVar22 + stride_w;
              } while (lVar21 != lVar16);
            }
            if (0 < (int)uVar3) {
              pfVar22 = (float *)activation_params->data;
              uVar13 = 0;
              do {
                fVar29 = pfVar19[uVar13];
                fVar28 = fVar29;
                switch(activation_type) {
                case 1:
                  if (fVar29 <= 0.0) {
                    fVar28 = 0.0;
                  }
                  break;
                case 2:
                  fVar28 = (float)(~-(uint)(0.0 < fVar29) & (uint)*pfVar22 |
                                  -(uint)(0.0 < fVar29) & 0x3f800000) * fVar29;
                  break;
                case 3:
                  if (fVar29 <= *pfVar22) {
                    fVar29 = *pfVar22;
                  }
                  fVar28 = pfVar22[1];
                  if (fVar29 <= pfVar22[1]) {
                    fVar28 = fVar29;
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar29) {
                    fVar29 = 88.37626;
                  }
                  fVar29 = expf((float)(-(uint)(fVar29 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar29 < -88.37626) & ((uint)fVar29 ^ auVar40._0_4_)
                                       ));
                  auVar38 = _DAT_005a4930;
                  auVar39 = _DAT_005a4940;
                  auVar40 = _DAT_005a4070;
                  fVar28 = 1.0 / (fVar29 + 1.0);
                  break;
                case 5:
                  fVar28 = expf(fVar29);
                  fVar28 = logf(fVar28 + 1.0);
                  fVar28 = tanhf(fVar28);
                  auVar38 = _DAT_005a4930;
                  auVar39 = _DAT_005a4940;
                  auVar40 = _DAT_005a4070;
                  fVar28 = fVar28 * fVar29;
                  break;
                case 6:
                  fVar1 = *pfVar22;
                  fVar34 = (float)((uint)pfVar22[1] ^ auVar40._0_4_) / fVar1;
                  fVar28 = 0.0;
                  if ((fVar34 <= fVar29) && (fVar28 = fVar29, fVar29 <= fVar34 + 1.0 / fVar1)) {
                    fVar28 = (fVar1 * fVar29 + pfVar22[1]) * fVar29;
                  }
                }
                pfVar19[uVar13] = fVar28;
                uVar13 = uVar13 + 1;
              } while (uVar15 != uVar13);
            }
            uVar18 = uVar18 + 1;
            local_118 = (float *)((long)local_118 + lVar17);
            pfVar19 = (float *)((long)pfVar19 + lVar17);
            local_130 = (void *)((long)local_130 + (long)(iVar10 * kernel_w) * 4);
          } while (uVar18 != (uVar8 & 0xffffffff));
        }
        local_f0 = local_f0 + 1;
        local_88 = (float *)((long)local_88 + lVar26);
        local_80 = (float *)((long)local_80 + lVar26);
        local_e8 = (ulong)(uint)((int)local_e8 + iVar11 * iVar10 * kernel_w);
      } while (local_f0 != (uint)group);
    }
  }
  return (int)local_e8;
}

Assistant:

static int deconvolutiondepthwise1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    // depth-wise
    if (h == group && group == outh)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat out = top_blob.row_range(g, 1);

            const float* inptr = bottom_blob.row(g);
            const float* kptr = (const float*)weight_data + kernel_w * g;

            const float bias = bias_term ? bias_data[g] : 0.f;

            out.fill(bias);

            for (int j = 0; j < w; j++)
            {
                float* outptr = (float*)out + j * stride_w;

                const float val = inptr[j];

                for (int k = 0; k < kernel_w; k++)
                {
                    float w = kptr[k];
                    outptr[k * dilation_w] += val * w;
                }
            }

            {
                float* outptr = out;

                for (int i = 0; i < outw; i++)
                {
                    outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                }
            }
        }
    }
    else
    {
        const int h_g = h / group;
        const int outh_g = outh / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outh_g; p++)
            {
                Mat out = top_blob.row_range(g * outh_g + p, 1);

                const float* weight_data_ptr = (const float*)weight_data + kernel_w * h_g * outh_g * g;
                const float bias = bias_term ? bias_data[g * outh_g + p] : 0.f;

                out.fill(bias);

                for (int j = 0; j < w; j++)
                {
                    float* outptr = (float*)out + j * stride_w;

                    const float* kptr = weight_data_ptr + kernel_w * h_g * p;

                    for (int q = 0; q < h_g; q++)
                    {
                        const float val = bottom_blob.row(h_g * g + q)[j];

                        for (int k = 0; k < kernel_w; k++)
                        {
                            outptr[k * dilation_w] += val * kptr[k];
                        }

                        kptr += kernel_w;
                    }
                }

                {
                    float* outptr = out;

                    for (int i = 0; i < outw; i++)
                    {
                        outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                    }
                }
            }
        }
    }

    return 0;
}